

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.h
# Opt level: O0

void sha512_block_pad(sha512_block *blk,BinarySink *bs)

{
  uint64_t val;
  uint64_t val_00;
  size_t sVar1;
  size_t pad;
  uint64_t final_lenlo;
  uint64_t final_lenhi;
  BinarySink *bs_local;
  sha512_block *blk_local;
  
  val = blk->lenhi;
  val_00 = blk->lenlo;
  sVar1 = blk->used;
  BinarySink_put_byte(bs->binarysink_,0x80);
  BinarySink_put_padding(bs->binarysink_,0x6f - sVar1 & 0x7f,'\0');
  BinarySink_put_uint64(bs->binarysink_,val);
  BinarySink_put_uint64(bs->binarysink_,val_00);
  if (blk->used != 0) {
    __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha512.h"
                  ,0x82,"void sha512_block_pad(sha512_block *, BinarySink *)");
  }
  return;
}

Assistant:

static inline void sha512_block_pad(sha512_block *blk, BinarySink *bs)
{
    uint64_t final_lenhi = blk->lenhi;
    uint64_t final_lenlo = blk->lenlo;
    size_t pad = 127 & (111 - blk->used);

    put_byte(bs, 0x80);
    put_padding(bs, pad, 0);
    put_uint64(bs, final_lenhi);
    put_uint64(bs, final_lenlo);

    assert(blk->used == 0 && "Should have exactly hit a block boundary");
}